

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

void __thiscall QWidget::adjustSize(QWidget *this)

{
  QWidgetPrivate *this_00;
  QLayout *this_01;
  QSize QVar1;
  long in_FS_OFFSET;
  QSize local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  ensurePolished(this);
  QVar1 = QWidgetPrivate::adjustedSize(this_00);
  this_01 = this_00->layout;
  local_28 = QVar1;
  if (this_01 != (QLayout *)0x0) {
    QLayout::activate(this_01);
  }
  if (((ulong)QVar1 & 0x8000000080000000) == 0) {
    resize(this,&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::adjustSize()
{
    Q_D(QWidget);
    ensurePolished();
    QSize s = d->adjustedSize();

    if (d->layout)
        d->layout->activate();

    if (s.isValid())
        resize(s);
}